

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrestler.cpp
# Opt level: O2

void __thiscall fp_remover::classes::Wrestler::Wrestler(Wrestler *this,string *name)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  Character::Character(&this->super_Character,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->first_name)._M_dataplus._M_p = (pointer)&(this->first_name).field_2;
  (this->first_name)._M_string_length = 0;
  (this->first_name).field_2._M_local_buf[0] = '\0';
  (this->last_name)._M_dataplus._M_p = (pointer)&(this->last_name).field_2;
  (this->last_name)._M_string_length = 0;
  (this->last_name).field_2._M_local_buf[0] = '\0';
  (this->nickname)._M_dataplus._M_p = (pointer)&(this->nickname).field_2;
  (this->nickname)._M_string_length = 0;
  (this->nickname).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Wrestler::Wrestler(string name) : Character(name)
{

}